

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

string * parse_util::get_param(string *instr,string *open_par,string *close_par)

{
  ulong in_RCX;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type end;
  size_type pos;
  string *temp;
  string local_68 [32];
  undefined8 local_48;
  long local_40;
  allocator local_22;
  undefined1 local_21;
  ulong local_20;
  ulong local_18;
  string *local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  local_40 = std::__cxx11::string::find(local_10,local_18);
  if (local_40 != -1) {
    local_48 = std::__cxx11::string::find_last_of(local_10,local_20);
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    std::__cxx11::string::operator=(in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

string get_param(const string &instr, const string &open_par,
                     const string &close_par)
    {
        string temp("");
        string::size_type pos = instr.find(open_par);

        if (pos != string::npos) {
            string::size_type end = instr.find_last_of(close_par);
            temp = instr.substr(pos+1, end-pos-1);
        }

        return temp;
    }